

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t suov16(CPUTriCoreState *env,int32_t hw0,int32_t hw1)

{
  int32_t av1;
  int32_t av0;
  int32_t max_pos;
  int32_t hw1_local;
  int32_t hw0_local;
  CPUTriCoreState *env_local;
  
  env->PSW_USB_V = 0;
  if (hw0 < 0x10000) {
    max_pos = hw0;
    if (hw0 < 0) {
      env->PSW_USB_V = 0x80000000;
      max_pos = 0;
    }
  }
  else {
    env->PSW_USB_V = 0x80000000;
    max_pos = 0xffff;
  }
  if (hw1 < 0x10000) {
    av0 = hw1;
    if (hw1 < 0) {
      env->PSW_USB_V = 0x80000000;
      av0 = 0;
    }
  }
  else {
    env->PSW_USB_V = 0x80000000;
    av0 = 0xffff;
  }
  env->PSW_USB_SV = env->PSW_USB_V | env->PSW_USB_SV;
  env->PSW_USB_AV = (hw0 ^ hw0 << 1 | hw1 ^ hw1 << 1) << 0x10;
  env->PSW_USB_SAV = env->PSW_USB_AV | env->PSW_USB_SAV;
  return max_pos & 0xffffU | av0 << 0x10;
}

Assistant:

static uint32_t suov16(CPUTriCoreState *env, int32_t hw0, int32_t hw1)
{
    int32_t max_pos = UINT16_MAX;
    int32_t av0, av1;

    env->PSW_USB_V = 0;
    av0 = hw0 ^ hw0 * 2u;
    if (hw0 > max_pos) {
        env->PSW_USB_V = (1 << 31);
        hw0 = max_pos;
    } else if (hw0 < 0) {
        env->PSW_USB_V = (1 << 31);
        hw0 = 0;
    }

    av1 = hw1 ^ hw1 * 2u;
    if (hw1 > max_pos) {
        env->PSW_USB_V = (1 << 31);
        hw1 = max_pos;
    } else if (hw1 < 0) {
        env->PSW_USB_V = (1 << 31);
        hw1 = 0;
    }

    env->PSW_USB_SV |= env->PSW_USB_V;
    env->PSW_USB_AV = (av0 | av1) << 16;
    env->PSW_USB_SAV |= env->PSW_USB_AV;
    return (hw0 & 0xffff) | (hw1 << 16);
}